

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

nk_font * nk_font_atlas_add_compressed_base85
                    (nk_font_atlas *atlas,char *data_base85,float height,nk_font_config *config)

{
  char cVar1;
  int iVar2;
  int *compressed_data;
  int *piVar3;
  nk_font *pnVar4;
  nk_size compressed_size;
  
  if (atlas == (nk_font_atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x3025,
                  "struct nk_font *nk_font_atlas_add_compressed_base85(struct nk_font_atlas *, const char *, float, const struct nk_font_config *)"
                 );
  }
  if ((atlas->temporary).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->temporary.alloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x3026,
                  "struct nk_font *nk_font_atlas_add_compressed_base85(struct nk_font_atlas *, const char *, float, const struct nk_font_config *)"
                 );
  }
  if ((atlas->temporary).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->temporary.free",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x3027,
                  "struct nk_font *nk_font_atlas_add_compressed_base85(struct nk_font_atlas *, const char *, float, const struct nk_font_config *)"
                 );
  }
  if ((atlas->permanent).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->permanent.alloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x3028,
                  "struct nk_font *nk_font_atlas_add_compressed_base85(struct nk_font_atlas *, const char *, float, const struct nk_font_config *)"
                 );
  }
  if ((atlas->permanent).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->permanent.free",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x3029,
                  "struct nk_font *nk_font_atlas_add_compressed_base85(struct nk_font_atlas *, const char *, float, const struct nk_font_config *)"
                 );
  }
  if (data_base85 == (char *)0x0) {
    __assert_fail("data_base85",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x302b,
                  "struct nk_font *nk_font_atlas_add_compressed_base85(struct nk_font_atlas *, const char *, float, const struct nk_font_config *)"
                 );
  }
  iVar2 = nk_strlen(data_base85);
  compressed_size = (nk_size)((iVar2 + 4) / 5 << 2);
  compressed_data =
       (int *)(*(atlas->temporary).alloc)((atlas->temporary).userdata,(void *)0x0,compressed_size);
  piVar3 = compressed_data;
  if (compressed_data == (int *)0x0) {
    __assert_fail("compressed_data",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x3032,
                  "struct nk_font *nk_font_atlas_add_compressed_base85(struct nk_font_atlas *, const char *, float, const struct nk_font_config *)"
                 );
  }
  while( true ) {
    cVar1 = *data_base85;
    if (cVar1 == '\0') break;
    *piVar3 = (((((0x5b < data_base85[4] ^ 0xffffffdd) + (int)data_base85[4]) * 0x55 +
                (0x5b < data_base85[3] ^ 0xffffffdd) + (int)data_base85[3]) * 0x55 +
               (0x5b < data_base85[2] ^ 0xffffffdd) + (int)data_base85[2]) * 0x55 +
              (0x5b < data_base85[1] ^ 0xffffffdd) + (int)data_base85[1]) * 0x55 +
              ('[' < cVar1 ^ 0xffffffdd) + (int)cVar1;
    data_base85 = data_base85 + 5;
    piVar3 = piVar3 + 1;
  }
  pnVar4 = nk_font_atlas_add_compressed(atlas,compressed_data,compressed_size,height,config);
  (*(atlas->temporary).free)((atlas->temporary).userdata,compressed_data);
  return pnVar4;
}

Assistant:

NK_API struct nk_font*
nk_font_atlas_add_compressed_base85(struct nk_font_atlas *atlas,
    const char *data_base85, float height, const struct nk_font_config *config)
{
    int compressed_size;
    void *compressed_data;
    struct nk_font *font;

    NK_ASSERT(atlas);
    NK_ASSERT(atlas->temporary.alloc);
    NK_ASSERT(atlas->temporary.free);
    NK_ASSERT(atlas->permanent.alloc);
    NK_ASSERT(atlas->permanent.free);

    NK_ASSERT(data_base85);
    if (!atlas || !data_base85 || !atlas->temporary.alloc || !atlas->temporary.free ||
        !atlas->permanent.alloc || !atlas->permanent.free)
        return 0;

    compressed_size = (((int)nk_strlen(data_base85) + 4) / 5) * 4;
    compressed_data = atlas->temporary.alloc(atlas->temporary.userdata,0, (nk_size)compressed_size);
    NK_ASSERT(compressed_data);
    if (!compressed_data) return 0;
    nk_decode_85((unsigned char*)compressed_data, (const unsigned char*)data_base85);
    font = nk_font_atlas_add_compressed(atlas, compressed_data,
                    (nk_size)compressed_size, height, config);
    atlas->temporary.free(atlas->temporary.userdata, compressed_data);
    return font;
}